

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

Am_Object_Demon * __thiscall
Am_Demon_Set::Get_Object_Demon(Am_Demon_Set *this,Am_Object_Demon_Type type)

{
  Am_Object_Demon_Type type_local;
  Am_Demon_Set *this_local;
  
  if (type == Am_CREATE_OBJ) {
    this_local = (Am_Demon_Set *)this->data->create_demon;
  }
  else if (type == Am_COPY_OBJ) {
    this_local = (Am_Demon_Set *)this->data->copy_demon;
  }
  else if (type == Am_DESTROY_OBJ) {
    this_local = (Am_Demon_Set *)this->data->destroy_demon;
  }
  else {
    this_local = (Am_Demon_Set *)0x0;
  }
  return (Am_Object_Demon *)this_local;
}

Assistant:

Am_Object_Demon *
Am_Demon_Set::Get_Object_Demon(Am_Object_Demon_Type type) const
{
  switch (type) {
  case Am_CREATE_OBJ:
    return data->create_demon;
  case Am_COPY_OBJ:
    return data->copy_demon;
  case Am_DESTROY_OBJ:
    return data->destroy_demon;
  }
  return nullptr;
}